

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<long_double>_>::PrepareZ
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *y,
          TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *beta,int opt)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Fad<long_double> *pFVar7;
  longdouble *plVar8;
  long lVar9;
  longdouble *plVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  Vector<long_double> *this_00;
  ulong uVar14;
  long lVar15;
  long local_90;
  Fad<long_double> local_68;
  
  lVar5 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(z,lVar5,lVar6);
  if (0 < lVar6) {
    local_90 = 0;
    lVar15 = 0;
    do {
      if (((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow < 1) ||
         ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= lVar15)) {
        TPZFMatrix<Fad<long_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
        ;
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar13 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
      pFVar7 = z->fElem;
      local_68.dx_.num_elts = 0;
      local_68.dx_.ptr_to_data = (longdouble *)0x0;
      local_68.defaultVal._0_8_ = 0;
      local_68.defaultVal._8_2_ = 0;
      lVar1 = beta->val_;
      local_68.val_ = (longdouble)0;
      Fad<long_double>::~Fad(&local_68);
      if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
        if (z != y) {
          memcpy(pFVar7 + lVar13 * lVar15,
                 y->fElem +
                 (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow * lVar15,
                 lVar5 * 0x30);
        }
        if (0 < lVar5) {
          lVar13 = 0;
          do {
            if (((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow <= lVar13) ||
               ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow * lVar15;
            pFVar7 = z->fElem + lVar9 + lVar13;
            iVar3 = (beta->dx_).num_elts;
            uVar4 = z->fElem[lVar9 + lVar13].dx_.num_elts;
            uVar14 = (ulong)uVar4;
            lVar1 = beta->val_;
            if ((long)iVar3 == 0) {
              if ((uVar14 != 0) && (0 < (int)uVar4)) {
                plVar8 = (pFVar7->dx_).ptr_to_data;
                lVar9 = 0;
                do {
                  *(longdouble *)((long)plVar8 + lVar9) =
                       *(longdouble *)((long)plVar8 + lVar9) * lVar1;
                  lVar9 = lVar9 + 0x10;
                } while (uVar14 << 4 != lVar9);
              }
            }
            else {
              plVar8 = (beta->dx_).ptr_to_data;
              if (uVar14 == 0) {
                (pFVar7->dx_).num_elts = iVar3;
                uVar11 = (long)iVar3 * 0x10;
                uVar14 = uVar11;
                if (iVar3 < 0) {
                  uVar14 = 0xffffffffffffffff;
                }
                plVar10 = (longdouble *)operator_new__(uVar14);
                (pFVar7->dx_).ptr_to_data = plVar10;
                if (0 < iVar3) {
                  lVar2 = pFVar7->val_;
                  uVar14 = 0;
                  do {
                    *(longdouble *)((long)plVar10 + uVar14) =
                         *(longdouble *)((long)plVar8 + uVar14) * lVar2;
                    uVar14 = uVar14 + 0x10;
                  } while (uVar11 != uVar14);
                }
              }
              else if (0 < (int)uVar4) {
                plVar10 = (pFVar7->dx_).ptr_to_data;
                lVar9 = 0;
                do {
                  *(longdouble *)((long)plVar10 + lVar9) =
                       *(longdouble *)((long)plVar10 + lVar9) * lVar1 +
                       *(longdouble *)((long)plVar8 + lVar9) * pFVar7->val_;
                  lVar9 = lVar9 + 0x10;
                } while (uVar14 << 4 != lVar9);
              }
            }
            pFVar7->val_ = pFVar7->val_ * lVar1;
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar5);
        }
      }
      else if (lVar5 != 0) {
        this_00 = (Vector<long_double> *)((long)&(pFVar7->dx_).num_elts + lVar13 * local_90);
        sVar12 = lVar5 * 0x30;
        do {
          *(longdouble *)(this_00 + -1) = (longdouble)0;
          if (this_00->num_elts != 0) {
            local_68.val_ = (longdouble)0;
            Vector<long_double>::operator=(this_00,&local_68.val_);
          }
          this_00 = this_00 + 3;
          sVar12 = sVar12 - 0x30;
        } while (sVar12 != 0);
      }
      lVar15 = lVar15 + 1;
      local_90 = local_90 + 0x30;
    } while (lVar15 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}